

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

boolean flush_bits(working_state *state)

{
  size_t *psVar1;
  jpeg_destination_mgr *pjVar2;
  uint uVar3;
  boolean bVar4;
  byte bVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  ulong uVar9;
  byte *__src;
  ulong uVar10;
  JOCTET _buffer [512];
  byte local_238 [520];
  
  __src = local_238;
  pbVar7 = local_238;
  uVar3 = 0x40 - (state->cur).free_bits;
  uVar9 = state->free_in_buffer;
  if (0x1ff < uVar9) {
    pbVar7 = state->next_output_byte;
  }
  uVar10 = (state->cur).put_buffer.c;
  if (7 < (int)uVar3) {
    lVar6 = (ulong)uVar3 + 8;
    do {
      bVar5 = (byte)(uVar10 >> ((char)lVar6 - 0x10U & 0x3f));
      *pbVar7 = bVar5;
      pbVar8 = pbVar7 + 1;
      pbVar7[1] = 0;
      pbVar7 = pbVar7 + 2;
      if (bVar5 != 0xff) {
        pbVar7 = pbVar8;
      }
      lVar6 = lVar6 + -8;
      uVar3 = uVar3 - 8;
    } while (0xf < lVar6);
  }
  pbVar8 = pbVar7;
  if (uVar3 != 0) {
    bVar5 = (byte)(uVar10 << (8 - (byte)uVar3 & 0x3f)) | (byte)(0xff >> ((byte)uVar3 & 0x1f));
    *pbVar7 = bVar5;
    pbVar7[1] = 0;
    pbVar8 = pbVar7 + 2;
    if (bVar5 != 0xff) {
      pbVar8 = pbVar7 + 1;
    }
  }
  (state->cur).put_buffer.c = 0;
  (state->cur).free_bits = 0x40;
  if (uVar9 < 0x200) {
    for (uVar9 = (long)pbVar8 - (long)local_238; uVar9 != 0; uVar9 = uVar9 - uVar10) {
      uVar10 = state->free_in_buffer;
      if (uVar9 < state->free_in_buffer) {
        uVar10 = uVar9;
      }
      memcpy(state->next_output_byte,__src,uVar10);
      state->next_output_byte = state->next_output_byte + uVar10;
      psVar1 = &state->free_in_buffer;
      *psVar1 = *psVar1 - uVar10;
      if (*psVar1 == 0) {
        pjVar2 = state->cinfo->dest;
        bVar4 = (*pjVar2->empty_output_buffer)(state->cinfo);
        if (bVar4 == 0) {
          return 0;
        }
        state->next_output_byte = pjVar2->next_output_byte;
        state->free_in_buffer = pjVar2->free_in_buffer;
      }
      __src = __src + uVar10;
    }
  }
  else {
    state->free_in_buffer =
         (size_t)(state->next_output_byte + (state->free_in_buffer - (long)pbVar8));
    state->next_output_byte = pbVar8;
  }
  return 1;
}

Assistant:

LOCAL(boolean)
flush_bits(working_state *state)
{
  JOCTET _buffer[BUFSIZE], *buffer, temp;
  simd_bit_buf_type put_buffer;  int put_bits;
  int localbuf = 0;

  if (state->simd) {
#if defined(__aarch64__) && !defined(NEON_INTRINSICS)
    put_bits = state->cur.free_bits;
#else
    put_bits = SIMD_BIT_BUF_SIZE - state->cur.free_bits;
#endif
    put_buffer = state->cur.put_buffer.simd;
  } else {
    put_bits = BIT_BUF_SIZE - state->cur.free_bits;
    put_buffer = state->cur.put_buffer.c;
  }

  LOAD_BUFFER()

  while (put_bits >= 8) {
    put_bits -= 8;
    temp = (JOCTET)(put_buffer >> put_bits);
    EMIT_BYTE(temp)
  }
  if (put_bits) {
    /* fill partial byte with ones */
    temp = (JOCTET)((put_buffer << (8 - put_bits)) | (0xFF >> put_bits));
    EMIT_BYTE(temp)
  }

  if (state->simd) {                    /* and reset bit buffer to empty */
    state->cur.put_buffer.simd = 0;
#if defined(__aarch64__) && !defined(NEON_INTRINSICS)
    state->cur.free_bits = 0;
#else
    state->cur.free_bits = SIMD_BIT_BUF_SIZE;
#endif
  } else {
    state->cur.put_buffer.c = 0;
    state->cur.free_bits = BIT_BUF_SIZE;
  }
  STORE_BUFFER()

  return TRUE;
}